

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::PushScope(cmMakefile *this)

{
  cmStateSnapshot local_28;
  
  cmState::CreateVariableScopeSnapshot
            (&local_28,this->GlobalGenerator->CMakeInstance->State,&this->StateSnapshot);
  (this->StateSnapshot).Position.Position = local_28.Position.Position;
  (this->StateSnapshot).State = local_28.State;
  (this->StateSnapshot).Position.Tree = local_28.Position.Tree;
  PushLoopBlockBarrier(this);
  cmFileLockPool::PushFunctionScope(&this->GlobalGenerator->FileLockPool);
  return;
}

Assistant:

void cmMakefile::PushScope()
{
  this->StateSnapshot =
    this->GetState()->CreateVariableScopeSnapshot(this->StateSnapshot);
  this->PushLoopBlockBarrier();

#if defined(CMAKE_BUILD_WITH_CMAKE)
  this->GetGlobalGenerator()->GetFileLockPool().PushFunctionScope();
#endif
}